

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexSeparableKernel::set
          (PtexSeparableKernel *this,Res resVal,int uVal,int vVal,int uwVal,int vwVal,float *kuVal,
          float *kvVal,int rotVal)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined2 in_SI;
  undefined2 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  
  *in_RDI = in_SI;
  *(undefined4 *)(in_RDI + 2) = in_EDX;
  *(undefined4 *)(in_RDI + 4) = in_ECX;
  *(undefined4 *)(in_RDI + 6) = in_R8D;
  *(undefined4 *)(in_RDI + 8) = in_R9D;
  memcpy(in_RDI + 0x14,(void *)CONCAT44(uwVal,vwVal),(long)*(int *)(in_RDI + 6) << 2);
  memcpy(in_RDI + 0x28,(void *)CONCAT44(uVal,vVal),(long)*(int *)(in_RDI + 8) << 2);
  *(undefined2 **)(in_RDI + 0xc) = in_RDI + 0x14;
  *(undefined2 **)(in_RDI + 0x10) = in_RDI + 0x28;
  *(undefined4 *)(in_RDI + 0x3c) = this._0_4_;
  return;
}

Assistant:

void set(Res resVal,
             int uVal, int vVal,
             int uwVal, int vwVal,
             const float* kuVal, const float* kvVal, int rotVal=0)
    {
        assert(uwVal <= kmax && vwVal <= kmax);
        res = resVal;
        u = uVal;
        v = vVal;
        uw = uwVal;
        vw = vwVal;
        memcpy(kubuff, kuVal, sizeof(*ku)*uw);
        memcpy(kvbuff, kvVal, sizeof(*kv)*vw);
        ku = kubuff;
        kv = kvbuff;
        rot = rotVal;
    }